

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O0

void PEM_proc_type(char *buf,int type)

{
  char *local_20;
  char *str;
  int type_local;
  char *buf_local;
  
  if (type == 10) {
    local_20 = "ENCRYPTED";
  }
  else if (type == 0x1e) {
    local_20 = "MIC-CLEAR";
  }
  else if (type == 0x14) {
    local_20 = "MIC-ONLY";
  }
  else {
    local_20 = "BAD-TYPE";
  }
  OPENSSL_strlcat(buf,"Proc-Type: 4,",0x400);
  OPENSSL_strlcat(buf,local_20,0x400);
  OPENSSL_strlcat(buf,"\n",0x400);
  return;
}

Assistant:

static void PEM_proc_type(char buf[PEM_BUFSIZE], int type) {
  const char *str;

  if (type == PEM_TYPE_ENCRYPTED) {
    str = "ENCRYPTED";
  } else if (type == PEM_TYPE_MIC_CLEAR) {
    str = "MIC-CLEAR";
  } else if (type == PEM_TYPE_MIC_ONLY) {
    str = "MIC-ONLY";
  } else {
    str = "BAD-TYPE";
  }

  OPENSSL_strlcat(buf, "Proc-Type: 4,", PEM_BUFSIZE);
  OPENSSL_strlcat(buf, str, PEM_BUFSIZE);
  OPENSSL_strlcat(buf, "\n", PEM_BUFSIZE);
}